

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrgload.c
# Opt level: O0

FT_Error pfr_glyph_load_rec(PFR_Glyph glyph,FT_Stream stream,FT_ULong gps_offset,FT_ULong offset,
                           FT_ULong size)

{
  uint uVar1;
  FT_UInt FVar2;
  byte *p_00;
  FT_GlyphLoader pFVar3;
  int iVar4;
  FT_Error FVar5;
  int iVar6;
  FT_Int32 FVar7;
  PFR_SubGlyphRec *pPVar8;
  FT_Vector *local_90;
  FT_Vector *vec_1;
  FT_Vector *vec;
  PFR_SubGlyph subglyph;
  FT_Int num_points;
  FT_Int old_points;
  FT_Int i;
  FT_Outline *base;
  FT_GlyphLoader loader;
  FT_UInt count;
  FT_UInt old_count;
  FT_UInt n;
  FT_Byte *limit;
  FT_Byte *p;
  FT_Error error;
  FT_ULong size_local;
  FT_ULong offset_local;
  FT_ULong gps_offset_local;
  FT_Stream stream_local;
  PFR_Glyph glyph_local;
  
  p._4_4_ = FT_Stream_Seek(stream,gps_offset + offset);
  if ((p._4_4_ == 0) && (p._4_4_ = FT_Stream_EnterFrame(stream,size), p._4_4_ == 0)) {
    p_00 = stream->cursor;
    if ((size == 0) || ((*p_00 & 0x80) == 0)) {
      p._4_4_ = pfr_glyph_load_simple(glyph,p_00,p_00 + size);
      FT_Stream_ExitFrame(stream);
    }
    else {
      pFVar3 = glyph->loader;
      uVar1 = glyph->num_subs;
      p._4_4_ = pfr_glyph_load_compound(glyph,p_00,p_00 + size);
      FT_Stream_ExitFrame(stream);
      if (p._4_4_ == 0) {
        FVar2 = glyph->num_subs;
        for (count = 0; count < FVar2 - uVar1; count = count + 1) {
          iVar4 = (int)(pFVar3->base).outline.n_points;
          FVar5 = pfr_glyph_load_rec(glyph,stream,gps_offset,
                                     (ulong)glyph->subs[(ulong)uVar1 + (ulong)count].gps_offset,
                                     (ulong)glyph->subs[(ulong)uVar1 + (ulong)count].gps_size);
          if (FVar5 != 0) {
            return FVar5;
          }
          pPVar8 = glyph->subs + (ulong)uVar1 + (ulong)count;
          iVar6 = (pFVar3->base).outline.n_points - iVar4;
          if ((pPVar8->x_scale == 0x10000) && (pPVar8->y_scale == 0x10000)) {
            local_90 = (pFVar3->base).outline.points + iVar4;
            for (num_points = 0; num_points < iVar6; num_points = num_points + 1) {
              local_90->x = (long)pPVar8->x_delta + local_90->x;
              local_90->y = (long)pPVar8->y_delta + local_90->y;
              local_90 = local_90 + 1;
            }
          }
          else {
            vec_1 = (pFVar3->base).outline.points + iVar4;
            for (num_points = 0; num_points < iVar6; num_points = num_points + 1) {
              FVar7 = FT_MulFix_x86_64((FT_Int32)vec_1->x,(FT_Int32)pPVar8->x_scale);
              vec_1->x = (long)(FVar7 + pPVar8->x_delta);
              FVar7 = FT_MulFix_x86_64((FT_Int32)vec_1->y,(FT_Int32)pPVar8->y_scale);
              vec_1->y = (long)(FVar7 + pPVar8->y_delta);
              vec_1 = vec_1 + 1;
            }
          }
          p._4_4_ = 0;
        }
      }
    }
  }
  return p._4_4_;
}

Assistant:

static FT_Error
  pfr_glyph_load_rec( PFR_Glyph  glyph,
                      FT_Stream  stream,
                      FT_ULong   gps_offset,
                      FT_ULong   offset,
                      FT_ULong   size )
  {
    FT_Error  error;
    FT_Byte*  p;
    FT_Byte*  limit;


    if ( FT_STREAM_SEEK( gps_offset + offset ) ||
         FT_FRAME_ENTER( size )                )
      goto Exit;

    p     = (FT_Byte*)stream->cursor;
    limit = p + size;

    if ( size > 0 && *p & PFR_GLYPH_IS_COMPOUND )
    {
      FT_UInt         n, old_count, count;
      FT_GlyphLoader  loader = glyph->loader;
      FT_Outline*     base   = &loader->base.outline;


      old_count = glyph->num_subs;

      /* this is a compound glyph - load it */
      error = pfr_glyph_load_compound( glyph, p, limit );

      FT_FRAME_EXIT();

      if ( error )
        goto Exit;

      count = glyph->num_subs - old_count;

      FT_TRACE4(( "compound glyph with %d element%s (offset %lu):\n",
                  count,
                  count == 1 ? "" : "s",
                  offset ));

      /* now, load each individual glyph */
      for ( n = 0; n < count; n++ )
      {
        FT_Int        i, old_points, num_points;
        PFR_SubGlyph  subglyph;


        FT_TRACE4(( "  subglyph %d:\n", n ));

        subglyph   = glyph->subs + old_count + n;
        old_points = base->n_points;

        error = pfr_glyph_load_rec( glyph, stream, gps_offset,
                                    subglyph->gps_offset,
                                    subglyph->gps_size );
        if ( error )
          break;

        /* note that `glyph->subs' might have been re-allocated */
        subglyph   = glyph->subs + old_count + n;
        num_points = base->n_points - old_points;

        /* translate and eventually scale the new glyph points */
        if ( subglyph->x_scale != 0x10000L || subglyph->y_scale != 0x10000L )
        {
          FT_Vector*  vec = base->points + old_points;


          for ( i = 0; i < num_points; i++, vec++ )
          {
            vec->x = FT_MulFix( vec->x, subglyph->x_scale ) +
                       subglyph->x_delta;
            vec->y = FT_MulFix( vec->y, subglyph->y_scale ) +
                       subglyph->y_delta;
          }
        }
        else
        {
          FT_Vector*  vec = loader->base.outline.points + old_points;


          for ( i = 0; i < num_points; i++, vec++ )
          {
            vec->x += subglyph->x_delta;
            vec->y += subglyph->y_delta;
          }
        }

        /* proceed to next sub-glyph */
      }

      FT_TRACE4(( "end compound glyph with %d element%s\n",
                  count,
                  count == 1 ? "" : "s" ));
    }
    else
    {
      FT_TRACE4(( "simple glyph (offset %lu)\n", offset ));

      /* load a simple glyph */
      error = pfr_glyph_load_simple( glyph, p, limit );

      FT_FRAME_EXIT();
    }

  Exit:
    return error;
  }